

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

void int_rel_half_reif_real(IntVar *x,IntRelType t,int c,BoolView *r)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  IntVar *y;
  undefined8 extraout_RAX;
  BoolView *z;
  BoolView *y_00;
  bool bVar4;
  BoolView *x_00;
  bool bVar5;
  int iVar6;
  vec<Lit> ps2;
  vec<Lit> ps1;
  Lit local_17c;
  vec<Lit> local_178;
  vec<Lit> local_168;
  BoolView local_150;
  BoolView local_140;
  BoolView local_130;
  BoolView local_120;
  BoolView local_110;
  BoolView local_100;
  BoolView local_f0;
  BoolView local_e0;
  BoolView local_d0;
  BoolView local_c0;
  BoolView local_b0;
  BoolView local_a0;
  BoolView local_90;
  BoolView local_80;
  BoolView local_70;
  BoolView local_60;
  BoolView local_50;
  BoolView local_40;
  
  if ((uint)r->s * 2 + -1 == (int)sat.assigns.data[(uint)r->v]) {
    return;
  }
  if (((t == IRT_NE) && ((uint)r->s * -2 + 1 == (int)sat.assigns.data[(uint)r->v])) &&
     (iVar1 = (*(x->super_Var).super_Branching._vptr_Branching[3])(x), iVar1 == 2)) {
    if (c < (x->min).v) {
      return;
    }
    if ((x->max).v < c) {
      return;
    }
    if ((x->vals != (Tchar *)0x0) && (x->vals[c].v == '\0')) {
      return;
    }
    iVar1 = (*(x->super_Var).super_Branching._vptr_Branching[0x11])(x,(long)c,0,1);
    if ((char)iVar1 != '\0') {
      return;
    }
    puts("=====UNSATISFIABLE=====");
    printf("%% Top level failure!\n");
    exit(0);
  }
  iVar1 = (*(x->super_Var).super_Branching._vptr_Branching[3])(x);
  if (iVar1 == 1) {
    y = getConstant(0);
    int_rel_half_reif(x,t,y,r,0);
    return;
  }
  uVar2 = (*(x->super_Var).super_Branching._vptr_Branching[0xd])(x,(long)c,2);
  uVar3 = (*(x->super_Var).super_Branching._vptr_Branching[0xd])(x,(long)c,3);
  if (IRT_GT < t) {
    int_rel_half_reif_real();
    if (local_178.data != (Lit *)0x0) {
      free(local_178.data);
    }
    if (local_168.data != (Lit *)0x0) {
      free(local_168.data);
    }
    _Unwind_Resume(extraout_RAX);
  }
  iVar6 = (int)uVar2 >> 1;
  bVar5 = (bool)((byte)uVar2 & 1);
  iVar1 = (int)uVar3 >> 1;
  bVar4 = (bool)((byte)uVar3 & 1);
  switch(t) {
  case IRT_EQ:
    local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_50.v = r->v;
    local_50.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_50.s = (bool)(r->s ^ 1);
    local_60.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_60.v = bv_true.v;
    local_60.s = bv_true.s;
    local_40.v = iVar1;
    local_40.s = bVar4;
    bool_rel(&local_40,BRT_OR,&local_50,&local_60);
    x_00 = &local_70;
    local_70.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_80.v = r->v;
    y_00 = &local_80;
    local_80.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_80.s = (bool)(r->s ^ 1);
    z = &local_90;
    local_90.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_70.v = iVar6;
    local_70.s = bVar5;
    goto LAB_001b431f;
  case IRT_NE:
    local_168.sz = 0;
    local_168.cap = 0;
    local_168.data = (Lit *)0x0;
    local_178.sz = (uint)(bVar5 ^ 1) | uVar2 & 0xfffffffe;
    vec<Lit>::push(&local_168,(Lit *)&local_178);
    local_178.sz = (uint)(bVar4 ^ 1) | uVar3 & 0xfffffffe;
    vec<Lit>::push(&local_168,(Lit *)&local_178);
    local_178.sz = (r->s ^ 1) + r->v * 2;
    vec<Lit>::push(&local_168,(Lit *)&local_178);
    SAT::addClause(&sat,&local_168,false);
    local_178.sz = 0;
    local_178.cap = 0;
    local_178.data = (Lit *)0x0;
    local_17c.x = uVar2;
    vec<Lit>::push(&local_178,&local_17c);
    local_17c.x = uVar3;
    vec<Lit>::push(&local_178,&local_17c);
    local_17c.x = (r->s ^ 1) + r->v * 2;
    vec<Lit>::push(&local_178,&local_17c);
    SAT::addClause(&sat,&local_178,false);
    if (local_178.data != (Lit *)0x0) {
      free(local_178.data);
    }
    if (local_168.data == (Lit *)0x0) {
      return;
    }
    free(local_168.data);
    return;
  case IRT_LE:
    x_00 = &local_a0;
    local_a0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_b0.v = r->v;
    y_00 = &local_b0;
    local_b0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_b0.s = (bool)(r->s ^ 1);
    z = &local_c0;
    local_a0.v = iVar1;
    local_a0.s = bVar4;
    break;
  case IRT_LT:
    x_00 = &local_d0;
    local_d0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_d0.s = (bool)(bVar5 ^ 1);
    local_e0.v = r->v;
    y_00 = &local_e0;
    local_e0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_e0.s = (bool)(r->s ^ 1);
    z = &local_f0;
    local_d0.v = iVar6;
    goto LAB_001b41d0;
  case IRT_GE:
    x_00 = &local_100;
    local_100.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_110.v = r->v;
    y_00 = &local_110;
    local_110.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_110.s = (bool)(r->s ^ 1);
    z = &local_120;
    local_100.v = iVar6;
    local_100.s = bVar5;
LAB_001b41d0:
    (z->super_Var).super_Branching._vptr_Branching = (_func_int **)&PTR_finished_0020fb28;
    goto LAB_001b431f;
  case IRT_GT:
    x_00 = &local_130;
    local_130.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_130.s = (bool)(bVar4 ^ 1);
    local_140.v = r->v;
    y_00 = &local_140;
    local_140.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_140.s = (bool)(r->s ^ 1);
    z = &local_150;
    local_130.v = iVar1;
  }
  (z->super_Var).super_Branching._vptr_Branching = (_func_int **)&PTR_finished_0020fb28;
LAB_001b431f:
  z->v = bv_true.v;
  z->s = bv_true.s;
  bool_rel(x_00,BRT_OR,y_00,z);
  return;
}

Assistant:

void int_rel_half_reif_real(IntVar* x, IntRelType t, int c, BoolView r) {
	if (r.isFalse()) {
		return;
	}
	if (r.isTrue() && t == IRT_NE && x->getType() == INT_VAR_EL) {
		TL_SET(x, remVal, c);
		return;
	}
	if (x->getType() == INT_VAR) {
		assert(!so.lazy);
		IntVar* v = getConstant(c);
		int_rel_half_reif(x, t, v, r);
		return;
	}
	BoolView b1(x->getLit(c, LR_GE));
	BoolView b2(x->getLit(c, LR_LE));
	switch (t) {
		case IRT_EQ:
			bool_rel(b2, BRT_OR, ~r);
			bool_rel(b1, BRT_OR, ~r);
			break;
		case IRT_NE: {
			vec<Lit> ps1;
			ps1.push(~b1);
			ps1.push(~b2);
			ps1.push(~r);
			sat.addClause(ps1);
			vec<Lit> ps2;
			ps2.push(b1);
			ps2.push(b2);
			ps2.push(~r);
			sat.addClause(ps2);
		} break;
		case IRT_LE:
			bool_rel(b2, BRT_OR, ~r);
			break;
		case IRT_LT:
			bool_rel(~b1, BRT_OR, ~r);
			break;
		case IRT_GE:
			bool_rel(b1, BRT_OR, ~r);
			break;
		case IRT_GT:
			bool_rel(~b2, BRT_OR, ~r);
			break;
		default:
			NEVER;
	}
}